

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

uint32_t getTagNumber(char *tagname)

{
  int iVar1;
  uint32_t tagNum;
  ulong uVar2;
  
  if ((gMainTable.tagList != (uint16_t *)0x0) && (gMainTable.tagListSize != 0)) {
    uVar2 = 0;
    do {
      iVar1 = uprv_stricmp_63((char *)((ulong)((uint)gMainTable.tagList[uVar2] * 2) +
                                      (long)gMainTable.stringTable),tagname);
      if (iVar1 == 0) {
        return (uint32_t)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < gMainTable.tagListSize);
  }
  return 0xffffffff;
}

Assistant:

static uint32_t getTagNumber(const char *tagname) {
    if (gMainTable.tagList) {
        uint32_t tagNum;
        for (tagNum = 0; tagNum < gMainTable.tagListSize; tagNum++) {
            if (!uprv_stricmp(GET_STRING(gMainTable.tagList[tagNum]), tagname)) {
                return tagNum;
            }
        }
    }

    return UINT32_MAX;
}